

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DArrayCase::verify
          (TextureGather2DArrayCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  bool bVar1;
  const_reference gatherArgs;
  undefined7 extraout_var;
  Texture2DArrayView TVar2;
  Vector<float,_3> *local_a8;
  Texture2DArrayView local_a0;
  Texture2DArrayView local_90 [2];
  vector<float,_std::allocator<float>_> local_70;
  undefined1 local_58 [8];
  Vec3 texCoords [4];
  ConstPixelBufferAccess *rendered_local;
  int iterationNdx_local;
  TextureGather2DArrayCase *this_local;
  
  local_a8 = (Vector<float,_3> *)local_58;
  do {
    tcu::Vector<float,_3>::Vector(local_a8);
    local_a8 = local_a8 + 1;
  } while (local_a8 != (Vector<float,_3> *)(texCoords[3].m_data + 1));
  (*(this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[9])
            (&local_70,this,(ulong)ctx & 0xffffffff);
  computeTexCoordVecs<3>(&local_70,(Vector<float,_3> (*) [4])local_58);
  std::vector<float,_std::allocator<float>_>::~vector(&local_70);
  TVar2 = tcu::Texture2DArray::operator_cast_to_Texture2DArrayView(&this->m_swizzledTexture);
  local_a0.m_levels = TVar2.m_levels;
  local_a0.m_numLevels = TVar2.m_numLevels;
  TVar2 = getOneLevelSubView(&local_a0,(this->super_TextureGatherCase).m_baseLevel);
  local_90[0].m_levels = TVar2.m_levels;
  local_90[0].m_numLevels = TVar2.m_numLevels;
  gatherArgs = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
               ::operator[](&this->m_iterations,(long)(int)ctx);
  bVar1 = Functional::(anonymous_namespace)::TextureGatherCase::
          verify<tcu::Texture2DArrayView,tcu::Vector<float,3>>
                    ((TextureGatherCase *)this,(ConstPixelBufferAccess *)sig,local_90,
                     (Vector<float,_3> (*) [4])local_58,&gatherArgs->gatherArgs);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool TextureGather2DArrayCase::verify (int iterationNdx, const ConstPixelBufferAccess& rendered) const
{
	Vec3 texCoords[4];
	computeTexCoordVecs(computeQuadTexCoord(iterationNdx), texCoords);
	return TextureGatherCase::verify(rendered, getOneLevelSubView(tcu::Texture2DArrayView(m_swizzledTexture), m_baseLevel), texCoords, m_iterations[iterationNdx].gatherArgs);
}